

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

Matrix4f * Matrix4f::rotation(Matrix4f *__return_storage_ptr__,Vector3f *rDirection,float radians)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  float z;
  float y;
  float x;
  float sinTheta;
  float cosTheta;
  Vector3f normalizedDirection;
  float radians_local;
  Vector3f *rDirection_local;
  
  normalizedDirection.m_elements[1] = radians;
  unique0x100001ae = rDirection;
  Vector3f::normalized((Vector3f *)&sinTheta);
  dVar7 = cos((double)normalizedDirection.m_elements[1]);
  fVar5 = (float)dVar7;
  dVar7 = sin((double)normalizedDirection.m_elements[1]);
  fVar6 = (float)dVar7;
  pfVar4 = Vector3f::x((Vector3f *)&sinTheta);
  fVar1 = *pfVar4;
  pfVar4 = Vector3f::y((Vector3f *)&sinTheta);
  fVar2 = *pfVar4;
  pfVar4 = Vector3f::z((Vector3f *)&sinTheta);
  fVar3 = *pfVar4;
  Matrix4f(__return_storage_ptr__,fVar1 * fVar1 * (1.0 - fVar5) + fVar5,
           fVar2 * fVar1 * (1.0 - fVar5) + -(fVar3 * fVar6),
           fVar3 * fVar1 * (1.0 - fVar5) + fVar2 * fVar6,0.0,
           fVar1 * fVar2 * (1.0 - fVar5) + fVar3 * fVar6,fVar2 * fVar2 * (1.0 - fVar5) + fVar5,
           fVar3 * fVar2 * (1.0 - fVar5) + -(fVar1 * fVar6),0.0,
           fVar1 * fVar3 * (1.0 - fVar5) + -(fVar2 * fVar6),
           fVar2 * fVar3 * (1.0 - fVar5) + fVar1 * fVar6,fVar3 * fVar3 * (1.0 - fVar5) + fVar5,0.0,
           0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::rotation( const Vector3f& rDirection, float radians )
{
	Vector3f normalizedDirection = rDirection.normalized();
	
	float cosTheta = cos( radians );
	float sinTheta = sin( radians );

	float x = normalizedDirection.x();
	float y = normalizedDirection.y();
	float z = normalizedDirection.z();

	return Matrix4f
	(
		x * x * ( 1.0f - cosTheta ) + cosTheta,			y * x * ( 1.0f - cosTheta ) - z * sinTheta,		z * x * ( 1.0f - cosTheta ) + y * sinTheta,		0.0f,
		x * y * ( 1.0f - cosTheta ) + z * sinTheta,		y * y * ( 1.0f - cosTheta ) + cosTheta,			z * y * ( 1.0f - cosTheta ) - x * sinTheta,		0.0f,
		x * z * ( 1.0f - cosTheta ) - y * sinTheta,		y * z * ( 1.0f - cosTheta ) + x * sinTheta,		z * z * ( 1.0f - cosTheta ) + cosTheta,			0.0f,
		0.0f,											0.0f,											0.0f,											1.0f
	);
}